

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_ref_t art_node4_erase(art_t *art,art_node4_t *node,art_key_chunk_t key_chunk)

{
  byte bVar1;
  _Bool _Var2;
  art_t *art_00;
  byte in_DL;
  byte *in_RSI;
  size_t after_next;
  art_inner_node_t *inner_node;
  art_key_chunk_t remaining_child_key;
  art_ref_t remaining_child;
  uint8_t other_idx;
  size_t i;
  int idx;
  art_node_t *in_stack_ffffffffffffffa8;
  art_t *in_stack_ffffffffffffffb0;
  art_typecode_t typecode;
  byte *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  ulong local_28;
  int local_20;
  art_ref_t local_8;
  
  local_20 = -1;
  for (local_28 = 0; local_28 < in_RSI[6]; local_28 = local_28 + 1) {
    if (in_RSI[local_28 + 7] == in_DL) {
      local_20 = (int)local_28;
    }
  }
  if (local_20 == -1) {
    local_8 = art_get_ref(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,'\0');
  }
  else if (in_RSI[6] == 2) {
    bVar1 = (byte)local_20 ^ 1;
    local_8 = *(art_ref_t *)(in_RSI + (ulong)bVar1 * 8 + 0x10);
    bVar1 = in_RSI[(ulong)bVar1 + 7];
    _Var2 = art_is_leaf(0x139a2d);
    typecode = (art_typecode_t)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
    if (!_Var2) {
      in_stack_ffffffffffffffb8 =
           (byte *)art_deref((art_t *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),
                             (art_ref_t)in_stack_ffffffffffffffb8);
      memmove(in_stack_ffffffffffffffb8 + (long)(int)(uint)*in_RSI + 2,in_stack_ffffffffffffffb8 + 1
              ,(ulong)*in_stack_ffffffffffffffb8);
      memcpy(in_stack_ffffffffffffffb8 + 1,in_RSI + 1,(ulong)*in_RSI);
      in_stack_ffffffffffffffb8[(ulong)*in_RSI + 1] = bVar1;
      *in_stack_ffffffffffffffb8 = *in_stack_ffffffffffffffb8 + *in_RSI + 1;
    }
    art_node_free((art_t *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                  typecode);
  }
  else {
    art_00 = (art_t *)(long)(int)(((uint)in_RSI[6] - local_20) + -1);
    memmove(in_RSI + (long)local_20 + 7,in_RSI + (long)local_20 + 8,(size_t)art_00);
    memmove(in_RSI + (long)local_20 * 8 + 0x10,in_RSI + (long)local_20 * 8 + 0x18,(long)art_00 << 3)
    ;
    in_RSI[6] = in_RSI[6] - 1;
    local_8 = art_get_ref(art_00,in_stack_ffffffffffffffa8,'\0');
  }
  return local_8;
}

Assistant:

static inline art_ref_t art_node4_erase(art_t *art, art_node4_t *node,
                                        art_key_chunk_t key_chunk) {
    int idx = -1;
    for (size_t i = 0; i < node->count; ++i) {
        if (node->keys[i] == key_chunk) {
            idx = i;
        }
    }
    if (idx == -1) {
        return art_get_ref(art, (art_node_t *)node, CROARING_ART_NODE4_TYPE);
    }
    if (node->count == 2) {
        // Only one child remains after erasing, so compress the path by
        // removing this node.
        uint8_t other_idx = idx ^ 1;
        art_ref_t remaining_child = node->children[other_idx];
        art_key_chunk_t remaining_child_key = node->keys[other_idx];
        if (!art_is_leaf(remaining_child)) {
            // Correct the prefix of the child node.
            art_inner_node_t *inner_node =
                (art_inner_node_t *)art_deref(art, remaining_child);
            memmove(inner_node->prefix + node->base.prefix_size + 1,
                    inner_node->prefix, inner_node->prefix_size);
            memcpy(inner_node->prefix, node->base.prefix,
                   node->base.prefix_size);
            inner_node->prefix[node->base.prefix_size] = remaining_child_key;
            inner_node->prefix_size += node->base.prefix_size + 1;
        }
        art_node_free(art, (art_node_t *)node, CROARING_ART_NODE4_TYPE);
        return remaining_child;
    }
    // Shift other keys to maintain sorted order.
    size_t after_next = node->count - idx - 1;
    memmove(node->keys + idx, node->keys + idx + 1,
            after_next * sizeof(art_key_chunk_t));
    memmove(node->children + idx, node->children + idx + 1,
            after_next * sizeof(art_ref_t));
    node->count--;
    return art_get_ref(art, (art_node_t *)node, CROARING_ART_NODE4_TYPE);
}